

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O1

lzma_ret lzma_delta_coder_init
                   (lzma_next_coder_conflict *next,lzma_allocator *allocator,
                   lzma_filter_info *filters)

{
  int *piVar1;
  lzma_ret lVar2;
  lzma_coder_conflict *plVar3;
  lzma_options_delta *opt;
  
  if (next->coder == (lzma_coder_conflict *)0x0) {
    plVar3 = (lzma_coder_conflict *)lzma_alloc(0x150,allocator);
    next->coder = plVar3;
    if (plVar3 == (lzma_coder_conflict *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->end = delta_coder_end;
    (plVar3->next).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict *)0x0;
    (plVar3->next).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict
          *)0x0;
    (plVar3->next).end = (lzma_end_function_conflict)0x0;
    (plVar3->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict *)0x0;
    (plVar3->next).init = 0;
    (plVar3->next).code = (lzma_code_function_conflict)0x0;
    (plVar3->next).coder = (lzma_coder_conflict *)0x0;
    (plVar3->next).id = 0xffffffffffffffff;
  }
  piVar1 = (int *)filters->options;
  if (((piVar1 != (int *)0x0) && (*piVar1 == 0)) && (0xfffffeff < piVar1[1] - 0x101U)) {
    plVar3 = next->coder;
    *(ulong *)&plVar3->sequence = (ulong)(uint)piVar1[1];
    memset(&plVar3->header_pos,0,0x101);
    lVar2 = lzma_next_filter_init((lzma_next_coder *)next->coder,allocator,filters + 1);
    return lVar2;
  }
  return LZMA_OPTIONS_ERROR;
}

Assistant:

extern lzma_ret
lzma_delta_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters)
{
	const lzma_options_delta *opt;

	// Allocate memory for the decoder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		// End function is the same for encoder and decoder.
		next->end = &delta_coder_end;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Validate the options.
	if (lzma_delta_coder_memusage(filters[0].options) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Set the delta distance.
	opt = filters[0].options;
	next->coder->distance = opt->dist;

	// Initialize the rest of the variables.
	next->coder->pos = 0;
	memzero(next->coder->history, LZMA_DELTA_DIST_MAX);

	// Initialize the next decoder in the chain, if any.
	return lzma_next_filter_init(&next->coder->next,
			allocator, filters + 1);
}